

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O1

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,XrSceneComponentsGetInfoMSFT *value,
               string *prefix,string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  byte bVar1;
  XrStructureType XVar2;
  XrSceneComponentTypeMSFT XVar3;
  pointer pcVar4;
  PFN_xrStructureTypeToString p_Var5;
  void *value_00;
  XrStructureType __val;
  XrSceneComponentTypeMSFT __val_00;
  uint uVar6;
  bool bVar7;
  char *pcVar8;
  XrInstance pXVar9;
  invalid_argument *this;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  XrGeneratedDispatchTable *dispatch_table;
  uint uVar13;
  string next_prefix;
  string type_prefix;
  string componenttype_prefix;
  string __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  XrGeneratedDispatchTable *local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  local_c0._M_dataplus._M_p = (pointer)value;
  local_a0 = gen_dispatch_table;
  std::__cxx11::string::_M_construct((ulong)&local_108,'\x12');
  *local_108._M_dataplus._M_p = '0';
  local_108._M_dataplus._M_p[1] = 'x';
  pcVar8 = local_108._M_dataplus._M_p + (local_108._M_string_length - 1);
  lVar11 = 0;
  do {
    bVar1 = *(byte *)((long)&local_c0._M_dataplus._M_p + lVar11);
    *pcVar8 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar1 & 0xf];
    pcVar8[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar1 >> 4];
    lVar11 = lVar11 + 1;
    pcVar8 = pcVar8 + -2;
  } while (lVar11 != 8);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,&local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)prefix);
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  pcVar4 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c0,pcVar4,pcVar4 + prefix->_M_string_length);
  dispatch_table = local_a0;
  std::__cxx11::string::append((char *)&local_c0);
  if (dispatch_table == (XrGeneratedDispatchTable *)0x0) {
    XVar2 = value->type;
    __val = -XVar2;
    if (0 < (int)XVar2) {
      __val = XVar2;
    }
    uVar13 = 1;
    if (XR_TYPE_SWAPCHAIN_CREATE_INFO < __val) {
      uVar12 = (ulong)__val;
      uVar6 = 4;
      do {
        uVar13 = uVar6;
        uVar10 = (uint)uVar12;
        if (uVar10 < 100) {
          uVar13 = uVar13 - 2;
          goto LAB_001863e3;
        }
        if (uVar10 < 1000) {
          uVar13 = uVar13 - 1;
          goto LAB_001863e3;
        }
        if (uVar10 < 10000) goto LAB_001863e3;
        uVar12 = uVar12 / 10000;
        uVar6 = uVar13 + 4;
      } while (99999 < uVar10);
      uVar13 = uVar13 + 1;
    }
LAB_001863e3:
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    local_78 = (vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents;
    std::__cxx11::string::_M_construct((ulong)&local_108,(char)uVar13 - (char)((int)XVar2 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_108._M_dataplus._M_p + (XVar2 >> 0x1f),uVar13,__val);
    contents = (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_78;
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              (local_78,(char (*) [16])"XrStructureType",&local_c0,&local_108);
    dispatch_table = local_a0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_d8 = 0;
    uStack_d0 = 0;
    local_e8 = 0;
    uStack_e0 = 0;
    local_108.field_2._M_allocated_capacity = 0;
    local_108.field_2._8_8_ = 0;
    local_108._M_dataplus._M_p = (pointer)0x0;
    local_108._M_string_length = 0;
    p_Var5 = dispatch_table->StructureTypeToString;
    pXVar9 = FindInstanceFromDispatchTable(dispatch_table);
    (*p_Var5)(pXVar9,value->type,(char *)&local_108);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&local_c0,(char (*) [64])&local_108);
  }
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  pcVar4 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_108,pcVar4,pcVar4 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_108);
  value_00 = value->next;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,local_108._M_dataplus._M_p,
             local_108._M_dataplus._M_p + local_108._M_string_length);
  bVar7 = ApiDumpDecodeNextChain(dispatch_table,value_00,&local_50,contents);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (!bVar7) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"Invalid Operation");
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  pcVar4 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,pcVar4,pcVar4 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_98);
  XVar3 = value->componentType;
  __val_00 = -XVar3;
  if (~XR_SCENE_COMPONENT_TYPE_INVALID_MSFT < XVar3) {
    __val_00 = XVar3;
  }
  uVar13 = 1;
  if (9 < (uint)__val_00) {
    uVar12 = (ulong)(uint)__val_00;
    uVar6 = 4;
    do {
      uVar13 = uVar6;
      uVar10 = (uint)uVar12;
      if (uVar10 < 100) {
        uVar13 = uVar13 - 2;
        goto LAB_0018656f;
      }
      if (uVar10 < 1000) {
        uVar13 = uVar13 - 1;
        goto LAB_0018656f;
      }
      if (uVar10 < 10000) goto LAB_0018656f;
      uVar12 = uVar12 / 10000;
      uVar6 = uVar13 + 4;
    } while (99999 < uVar10);
    uVar13 = uVar13 + 1;
  }
LAB_0018656f:
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_70,(char)uVar13 - (char)(XVar3 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_70._M_dataplus._M_p + ((uint)XVar3 >> 0x1f),uVar13,__val_00);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[25],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [25])"XrSceneComponentTypeMSFT",&local_98,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrSceneComponentsGetInfoMSFT* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string componenttype_prefix = prefix;
        componenttype_prefix += "componentType";
        contents.emplace_back("XrSceneComponentTypeMSFT", componenttype_prefix, std::to_string(value->componentType));
        return true;
    } catch(...) {
    }
    return false;
}